

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O3

void __thiscall QPushButton::keyPressEvent(QPushButton *this,QKeyEvent *e)

{
  QPushButtonPrivate *this_00;
  byte bVar1;
  QDialog *pQVar2;
  QPushButtonPrivate *d;
  
  if ((*(uint *)(e + 0x40) & 0xfffffffe) == 0x1000004) {
    this_00 = *(QPushButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
    bVar1 = this_00->field_0x2c8;
    if ((bVar1 & 3) != 0) {
      if ((bVar1 & 3) != 2) goto LAB_0046b082;
      pQVar2 = QPushButtonPrivate::dialogParent(this_00);
      if (pQVar2 != (QDialog *)0x0) goto LAB_0046b082;
      bVar1 = this_00->field_0x2c8;
    }
    if ((bVar1 & 4) != 0) {
LAB_0046b082:
      QAbstractButton::click(&this->super_QAbstractButton);
      return;
    }
  }
  QAbstractButton::keyPressEvent(&this->super_QAbstractButton,e);
  return;
}

Assistant:

void QPushButton::keyPressEvent(QKeyEvent *e)
{
    Q_D(QPushButton);
    switch (e->key()) {
    case Qt::Key_Enter:
    case Qt::Key_Return:
        if (autoDefault() || d->defaultButton) {
            click();
            break;
        }
        Q_FALLTHROUGH();
    default:
        QAbstractButton::keyPressEvent(e);
    }
}